

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O0

void xmrig::cryptonight_double_hash<true>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *l;
  uint8_t *l_00;
  uint64_t *st;
  uint64_t *st_00;
  long lVar4;
  long lVar5;
  long lVar6;
  __m128i bx0;
  __m128i bx0_00;
  __m128i bx1;
  __m128i bx1_00;
  __m128i *palVar7;
  uint32_t uVar8;
  uint uVar9;
  uint *puVar10;
  ulong uVar11;
  uint64_t uVar12;
  long *in_RCX;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint8_t *in_RDX;
  longlong in_R8;
  __m128i *in_R9;
  __m128i *cx;
  uint64_t extraout_XMM0_Qa;
  uint64_t extraout_XMM0_Qa_00;
  __m128i ax0_00;
  __m128i ax0_01;
  __m128i chunk3_1;
  __m128i chunk2_1;
  __m128i chunk1_1;
  uint64_t division_result_1;
  uint64_t cx_1_1;
  uint32_t d_1;
  uint64_t cx_0_1;
  uint64_t sqrt_result_1;
  __m128i chunk3;
  __m128i chunk2;
  __m128i chunk1;
  uint64_t division_result;
  uint64_t cx_1;
  uint32_t d;
  uint64_t cx_0;
  uint64_t sqrt_result;
  uint64_t ch;
  uint64_t cl;
  uint64_t lo;
  uint64_t hi;
  __m128i ax1;
  __m128i ax0;
  __m128i cx1;
  __m128i cx0;
  size_t i;
  uint64_t idx1;
  uint64_t idx0;
  __m128i bx11;
  __m128i bx10;
  __m128i bx01;
  __m128i bx00;
  uint64_t ah1;
  uint64_t ah0;
  uint64_t al1;
  uint64_t al0;
  __m128i sqrt_result_xmm_1;
  __m128i division_result_xmm_1;
  __m128i sqrt_result_xmm_0;
  __m128i division_result_xmm_0;
  uint64_t *h1;
  uint64_t *h0;
  uint8_t *l1;
  uint8_t *l0;
  uint32_t iters;
  size_t MASK;
  uint32_t y3_1;
  uint32_t y2_1;
  uint32_t y1_1;
  uint32_t y0_1;
  uint32_t x3_1;
  uint32_t x2_1;
  uint32_t x1_1;
  uint32_t x0_1;
  uint32_t y3;
  uint32_t y2;
  uint32_t y1;
  uint32_t y0;
  uint32_t x3;
  uint32_t x2;
  uint32_t x1;
  uint32_t x0;
  size_t in_stack_fffffffffffff858;
  uint8_t *in_stack_fffffffffffff860;
  long in_stack_fffffffffffff868;
  long in_stack_fffffffffffff870;
  int local_758;
  int local_750;
  int local_6f8;
  int local_6f0;
  ulong local_6d0;
  ulong local_6c8;
  ulong uStack_6c0;
  ulong local_6b8;
  ulong uStack_6b0;
  ulong local_6a8;
  __m128i *palStack_6a0;
  __m128i *local_698;
  ulong uStack_690;
  ulong local_680;
  ulong local_678;
  __m128i *local_670;
  ulong local_668;
  __m128i *palStack_660;
  ulong local_658;
  __m128i *in_stack_fffffffffffff9b0;
  __m128i *output_00;
  __m128i *in_stack_fffffffffffff9b8;
  __m128i *input_00;
  ulong uStack_640;
  __m128i *local_638;
  ulong uStack_630;
  ulong local_628;
  ulong local_620;
  ulong local_618;
  ulong local_610;
  uint64_t local_608;
  ulong local_5f8;
  uint64_t local_5e8;
  ulong local_5d8;
  byte local_550;
  byte local_54c;
  byte local_548;
  byte local_544;
  byte local_510;
  byte local_50c;
  byte local_508;
  byte local_504;
  
  cx = in_R9;
  uVar8 = CnAlgo::iterations((CnAlgo *)
                             &cryptonight_double_hash<true>(unsigned_char_const*,unsigned_long,unsigned_char*,cryptonight_ctx**,unsigned_long,unsigned_long)
                              ::props);
  keccak(in_stack_fffffffffffff860,in_stack_fffffffffffff858,(uint8_t *)0x260af6);
  keccak(in_stack_fffffffffffff860,in_stack_fffffffffffff858,(uint8_t *)0x260b1a);
  l = *(uint8_t **)(*in_RCX + 0xe0);
  l_00 = *(uint8_t **)(in_RCX[1] + 0xe0);
  st = (uint64_t *)*in_RCX;
  st_00 = (uint64_t *)in_RCX[1];
  local_5d8 = st[0xc];
  local_5e8 = st[0xd];
  local_5f8 = st_00[0xc];
  local_608 = st_00[0xd];
  fesetround(0x400);
  cn_explode_scratchpad<true>(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  cn_explode_scratchpad<true>(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  local_670 = (__m128i *)(*st ^ st[4]);
  local_618 = *st_00 ^ st_00[4];
  local_620 = st[1] ^ st[5];
  local_628 = st_00[1] ^ st_00[5];
  uStack_630 = st[3] ^ st[7];
  local_638 = (__m128i *)(st[2] ^ st[6]);
  uStack_640 = st[9] ^ st[0xb];
  local_658 = st_00[2] ^ st_00[6];
  local_668 = st_00[8] ^ st_00[10];
  palStack_660 = (__m128i *)(st_00[9] ^ st_00[0xb]);
  output_00 = (__m128i *)(st_00[3] ^ st_00[7]);
  input_00 = (__m128i *)(st[8] ^ st[10]);
  local_610 = (ulong)local_670;
  for (local_680 = 0; palVar7 = local_638, local_678 = local_618,
      local_680 < ((long)*in_R9 + (ulong)uVar8 >> 1 & 0xffffffff); local_680 = local_680 + 1) {
    local_6b8 = local_610;
    uStack_6b0 = local_620;
    local_6c8 = local_618;
    uStack_6c0 = local_628;
    puVar10 = (uint *)(l + ((uint)local_670 & 0xffff0));
    uVar9 = *puVar10;
    uVar1 = puVar10[1];
    uVar2 = puVar10[2];
    uVar3 = puVar10[3];
    local_504 = (byte)uVar9;
    uVar13 = (ulong)local_504;
    local_508 = (byte)uVar1;
    uVar14 = (ulong)local_508;
    local_50c = (byte)uVar2;
    uVar15 = (ulong)local_50c;
    local_510 = (byte)uVar3;
    uVar11 = (ulong)local_510;
    local_508 = (byte)(uVar1 >> 8);
    uVar16 = (ulong)local_508;
    local_50c = (byte)(uVar2 >> 8);
    uVar17 = (ulong)local_50c;
    local_510 = (byte)(uVar3 >> 8);
    uVar18 = (ulong)local_510;
    local_504 = (byte)(uVar9 >> 8);
    uVar19 = (ulong)local_504;
    local_50c = (byte)(uVar2 >> 0x10);
    local_510 = (byte)(uVar3 >> 0x10);
    local_504 = (byte)(uVar9 >> 0x10);
    local_508 = (byte)(uVar1 >> 0x10);
    local_698 = (__m128i *)
                (CONCAT44(saes_table[0][uVar14] ^ saes_table[1][uVar17] ^ saes_table[2][local_510] ^
                          saes_table[2][(uVar9 >> 0x18) + 0x100],
                          saes_table[0][uVar13] ^ saes_table[1][uVar16] ^ saes_table[2][local_50c] ^
                          saes_table[2][(uVar3 >> 0x18) + 0x100]) ^ local_610);
    uStack_690 = CONCAT44(saes_table[0][uVar11] ^ saes_table[1][uVar19] ^ saes_table[2][local_508] ^
                          saes_table[2][(uVar2 >> 0x18) + 0x100],
                          saes_table[0][uVar15] ^ saes_table[1][uVar18] ^ saes_table[2][local_504] ^
                          saes_table[2][(uVar1 >> 0x18) + 0x100]) ^ local_620;
    puVar10 = (uint *)(l_00 + ((uint)local_618 & 0xffff0));
    uVar9 = *puVar10;
    uVar1 = puVar10[1];
    uVar2 = puVar10[2];
    uVar3 = puVar10[3];
    local_544 = (byte)uVar9;
    uVar13 = (ulong)local_544;
    local_548 = (byte)uVar1;
    uVar14 = (ulong)local_548;
    local_54c = (byte)uVar2;
    uVar15 = (ulong)local_54c;
    local_550 = (byte)uVar3;
    uVar11 = (ulong)local_550;
    local_548 = (byte)(uVar1 >> 8);
    uVar16 = (ulong)local_548;
    local_54c = (byte)(uVar2 >> 8);
    uVar17 = (ulong)local_54c;
    local_550 = (byte)(uVar3 >> 8);
    uVar18 = (ulong)local_550;
    local_544 = (byte)(uVar9 >> 8);
    uVar19 = (ulong)local_544;
    local_54c = (byte)(uVar2 >> 0x10);
    local_550 = (byte)(uVar3 >> 0x10);
    local_544 = (byte)(uVar9 >> 0x10);
    local_548 = (byte)(uVar1 >> 0x10);
    local_6a8 = CONCAT44(saes_table[0][uVar14] ^ saes_table[1][uVar17] ^ saes_table[2][local_550] ^
                         saes_table[2][(uVar9 >> 0x18) + 0x100],
                         saes_table[0][uVar13] ^ saes_table[1][uVar16] ^ saes_table[2][local_54c] ^
                         saes_table[2][(uVar3 >> 0x18) + 0x100]) ^ local_618;
    palStack_6a0 = (__m128i *)
                   (CONCAT44(saes_table[0][uVar11] ^ saes_table[1][uVar19] ^
                             saes_table[2][local_548] ^ saes_table[2][(uVar2 >> 0x18) + 0x100],
                             saes_table[0][uVar15] ^ saes_table[1][uVar18] ^
                             saes_table[2][local_544] ^ saes_table[2][(uVar1 >> 0x18) + 0x100]) ^
                   local_628);
    uVar13 = (ulong)((uint)local_670 & 0xffff0);
    bx0[1] = (longlong)in_stack_fffffffffffff860;
    bx0[0] = in_stack_fffffffffffff858;
    bx1[1] = in_stack_fffffffffffff870;
    bx1[0] = in_stack_fffffffffffff868;
    ax0_00[1] = in_R8;
    ax0_00[0] = (longlong)&local_698;
    cryptonight_monero_tweak((uint64_t *)(l + uVar13),l,uVar13,ax0_00,bx0,bx1,cx);
    uVar13 = (ulong)((uint)local_678 & 0xffff0);
    bx0_00[1] = (longlong)in_stack_fffffffffffff860;
    bx0_00[0] = in_stack_fffffffffffff858;
    bx1_00[1] = in_stack_fffffffffffff870;
    bx1_00[0] = in_stack_fffffffffffff868;
    ax0_01[1] = in_R8;
    ax0_01[0] = (longlong)&local_6a8;
    cryptonight_monero_tweak((uint64_t *)(l_00 + uVar13),l_00,uVar13,ax0_01,bx0_00,bx1_00,cx);
    local_670 = local_698;
    local_678 = local_6a8;
    uVar13 = *(ulong *)(l + ((ulong)local_698 & 0xffff0) + 8);
    uVar11 = *(ulong *)(l + ((ulong)local_698 & 0xffff0)) ^ local_5d8 ^ local_5e8 << 0x20;
    local_6f8 = (int)local_698;
    local_6f0 = (int)local_5e8;
    uVar9 = local_6f8 + local_6f0 * 2 | 0x80000001;
    local_5d8 = uStack_690 / uVar9 & 0xffffffff | uStack_690 % (ulong)uVar9 << 0x20;
    int_sqrt_v2((long)*local_698 + local_5d8);
    uVar12 = __umul128((uint64_t)local_670,uVar11,&local_6d0);
    uVar15 = *(ulong *)((long)(l + ((ulong)((uint)local_670 & 0xffff0) ^ 0x10)) + 8);
    uVar16 = *(ulong *)(l + ((ulong)((uint)local_670 & 0xffff0) ^ 0x10)) ^ local_6d0;
    lVar4 = *(long *)(l + ((ulong)local_670 & 0xffff0 ^ 0x20));
    lVar5 = *(long *)((long)(l + ((ulong)local_670 & 0xffff0 ^ 0x20)) + 8);
    local_6d0 = *(ulong *)(l + ((ulong)local_670 & 0xffff0 ^ 0x20)) ^ local_6d0;
    uVar14 = *(ulong *)(l + ((ulong)local_670 & 0xffff0 ^ 0x20) + 8);
    lVar6 = *(long *)((long)(l + ((ulong)local_670 & 0xffff0 ^ 0x30)) + 8);
    *(long *)(l + ((ulong)local_670 & 0xffff0 ^ 0x10)) =
         (long)*input_00 + *(long *)(l + ((ulong)local_670 & 0xffff0 ^ 0x30));
    *(ulong *)((long)(l + ((ulong)local_670 & 0xffff0 ^ 0x10)) + 8) = lVar6 + uStack_640;
    *(ulong *)(l + ((ulong)local_670 & 0xffff0 ^ 0x20)) = (long)*local_638 + uVar16;
    *(ulong *)((long)(l + ((ulong)local_670 & 0xffff0 ^ 0x20)) + 8) = (uVar15 ^ uVar12) + uStack_630
    ;
    *(ulong *)(l + ((ulong)local_670 & 0xffff0 ^ 0x30)) = lVar4 + local_6b8;
    *(ulong *)((long)(l + ((ulong)local_670 & 0xffff0 ^ 0x30)) + 8) = lVar5 + uStack_6b0;
    local_620 = (uVar14 ^ uVar12) + local_620;
    *(ulong *)(l + ((ulong)local_670 & 0xffff0)) = local_6d0 + local_610;
    *(ulong *)(l + ((ulong)local_670 & 0xffff0) + 8) = local_620;
    local_610 = uVar11 ^ local_6d0 + local_610;
    local_620 = uVar13 ^ local_620;
    uVar13 = *(ulong *)(l_00 + (local_678 & 0xffff0) + 8);
    uVar11 = *(ulong *)(l_00 + (local_678 & 0xffff0)) ^ local_5f8 ^ local_608 << 0x20;
    local_758 = (int)local_6a8;
    local_750 = (int)local_608;
    uVar9 = local_758 + local_750 * 2 | 0x80000001;
    local_5f8 = (ulong)palStack_6a0 / (ulong)uVar9 & 0xffffffff |
                (ulong)palStack_6a0 % (ulong)uVar9 << 0x20;
    local_670 = (__m128i *)local_610;
    int_sqrt_v2(local_6a8 + local_5f8);
    uVar12 = __umul128(local_678,uVar11,&local_6d0);
    uVar15 = *(ulong *)((long)(l_00 + ((ulong)((uint)local_678 & 0xffff0) ^ 0x10)) + 8);
    uVar16 = *(ulong *)(l_00 + ((ulong)((uint)local_678 & 0xffff0) ^ 0x10)) ^ local_6d0;
    in_stack_fffffffffffff868 = *(long *)(l_00 + (local_678 & 0xffff0 ^ 0x20));
    in_stack_fffffffffffff870 = *(long *)((long)(l_00 + (local_678 & 0xffff0 ^ 0x20)) + 8);
    local_6d0 = *(ulong *)(l_00 + (local_678 & 0xffff0 ^ 0x20)) ^ local_6d0;
    uVar14 = *(ulong *)(l_00 + (local_678 & 0xffff0 ^ 0x20) + 8);
    in_stack_fffffffffffff858 = *(size_t *)(l_00 + (local_678 & 0xffff0 ^ 0x30));
    in_stack_fffffffffffff860 = *(uint8_t **)((long)(l_00 + (local_678 & 0xffff0 ^ 0x30)) + 8);
    *(size_t *)(l_00 + (local_678 & 0xffff0 ^ 0x10)) = in_stack_fffffffffffff858 + local_668;
    *(uint8_t **)((long)(l_00 + (local_678 & 0xffff0 ^ 0x10)) + 8) =
         in_stack_fffffffffffff860 + (long)palStack_660;
    *(ulong *)(l_00 + (local_678 & 0xffff0 ^ 0x20)) = uVar16 + local_658;
    *(ulong *)((long)(l_00 + (local_678 & 0xffff0 ^ 0x20)) + 8) =
         (long)*output_00 + (uVar15 ^ uVar12);
    *(ulong *)(l_00 + (local_678 & 0xffff0 ^ 0x30)) = in_stack_fffffffffffff868 + local_6c8;
    *(ulong *)((long)(l_00 + (local_678 & 0xffff0 ^ 0x30)) + 8) =
         in_stack_fffffffffffff870 + uStack_6c0;
    local_628 = (uVar14 ^ uVar12) + local_628;
    *(ulong *)(l_00 + (local_678 & 0xffff0)) = local_6d0 + local_618;
    *(ulong *)(l_00 + (local_678 & 0xffff0) + 8) = local_628;
    local_618 = uVar11 ^ local_6d0 + local_618;
    local_628 = uVar13 ^ local_628;
    uStack_640 = uStack_630;
    local_668 = local_658;
    local_638 = local_698;
    uStack_630 = uStack_690;
    local_658 = local_6a8;
    palStack_660 = output_00;
    output_00 = palStack_6a0;
    input_00 = palVar7;
    local_608 = extraout_XMM0_Qa_00;
    local_5e8 = extraout_XMM0_Qa;
  }
  cn_implode_scratchpad<true>(input_00,output_00);
  cn_implode_scratchpad<true>(input_00,output_00);
  keccakf(st,0x18);
  keccakf(st_00,0x18);
  (*extra_hashes[(int)(*(byte *)*in_RCX & 3)])((uint8_t *)*in_RCX,200,in_RDX);
  (*extra_hashes[(int)(*(byte *)in_RCX[1] & 3)])((uint8_t *)in_RCX[1],200,in_RDX + 0x20);
  return;
}

Assistant:

inline void cryptonight_double_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    keccak(input,        size, ctx[0]->state);
    keccak(input + size, size, ctx[1]->state);

    uint8_t *l0  = ctx[0]->memory;
    uint8_t *l1  = ctx[1]->memory;
    uint64_t *h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint64_t *h1 = reinterpret_cast<uint64_t*>(ctx[1]->state);

    VARIANT2_INIT(0);
    VARIANT2_INIT(1);
    VARIANT2_SET_ROUNDING_MODE();

    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(h0), reinterpret_cast<__m128i *>(l0));
    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(h1), reinterpret_cast<__m128i *>(l1));

    uint64_t al0 = h0[0] ^ h0[4];
    uint64_t al1 = h1[0] ^ h1[4];
    uint64_t ah0 = h0[1] ^ h0[5];
    uint64_t ah1 = h1[1] ^ h1[5];

    __m128i bx00 = _mm_set_epi64x(h0[3] ^ h0[7], h0[2] ^ h0[6]);
    __m128i bx01 = _mm_set_epi64x(h0[9] ^ h0[11], h0[8] ^ h0[10]);
    __m128i bx10 = _mm_set_epi64x(h1[3] ^ h1[7], h1[2] ^ h1[6]);
    __m128i bx11 = _mm_set_epi64x(h1[9] ^ h1[11], h1[8] ^ h1[10]);

    uint64_t idx0 = al0;
    uint64_t idx1 = al1;

    for (size_t i = 0; i < iters; i++) {
        __m128i cx0, cx1;
        if (!SOFT_AES) {
            cx0 = _mm_load_si128(reinterpret_cast<const __m128i *>(&l0[idx0 & MASK]));
            cx1 = _mm_load_si128(reinterpret_cast<const __m128i *>(&l1[idx1 & MASK]));
        }

        const __m128i ax0 = _mm_set_epi64x(ah0, al0);
        const __m128i ax1 = _mm_set_epi64x(ah1, al1);
        if (SOFT_AES) {
            cx0 = soft_aesenc(&l0[idx0 & MASK], ax0, reinterpret_cast<const uint32_t*>(saes_table));
            cx1 = soft_aesenc(&l1[idx1 & MASK], ax1, reinterpret_cast<const uint32_t*>(saes_table));
        }
        else {
            cx0 = _mm_aesenc_si128(cx0, ax0);
            cx1 = _mm_aesenc_si128(cx1, ax1);
        }

        cryptonight_monero_tweak((uint64_t*)&l0[idx0 & MASK], l0, idx0 & MASK, ax0, bx00, bx01, cx0);
        cryptonight_monero_tweak((uint64_t*)&l1[idx1 & MASK], l1, idx1 & MASK, ax1, bx10, bx11, cx1);

        idx0 = _mm_cvtsi128_si64(cx0);
        idx1 = _mm_cvtsi128_si64(cx1);

        uint64_t hi, lo, cl, ch;
        cl = ((uint64_t*) &l0[idx0 & MASK])[0];
        ch = ((uint64_t*) &l0[idx0 & MASK])[1];

        VARIANT2_INTEGER_MATH(0, cl, cx0);

        lo = __umul128(idx0, cl, &hi);

        VARIANT2_SHUFFLE2(l0, idx0 & MASK, ax0, bx00, bx01, hi, lo, 0);

        al0 += hi;
        ah0 += lo;

        ((uint64_t*)&l0[idx0 & MASK])[0] = al0;
        ((uint64_t*) &l0[idx0 & MASK])[1] = ah0;

        al0 ^= cl;
        ah0 ^= ch;
        idx0 = al0;

        cl = ((uint64_t*) &l1[idx1 & MASK])[0];
        ch = ((uint64_t*) &l1[idx1 & MASK])[1];

        VARIANT2_INTEGER_MATH(1, cl, cx1);

        lo = __umul128(idx1, cl, &hi);

        VARIANT2_SHUFFLE2(l1, idx1 & MASK, ax1, bx10, bx11, hi, lo, 0);

        al1 += hi;
        ah1 += lo;

        ((uint64_t*)&l1[idx1 & MASK])[0] = al1;
        ((uint64_t*)&l1[idx1 & MASK])[1] = ah1;

        al1 ^= cl;
        ah1 ^= ch;
        idx1 = al1;

        bx01 = bx00;
        bx11 = bx10;

        bx00 = cx0;
        bx10 = cx1;
    }

    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(l0), reinterpret_cast<__m128i *>(h0));
    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(l1), reinterpret_cast<__m128i *>(h1));

    keccakf(h0, 24);
    keccakf(h1, 24);

    extra_hashes[ctx[0]->state[0] & 3](ctx[0]->state, 200, output);
    extra_hashes[ctx[1]->state[0] & 3](ctx[1]->state, 200, output + 32);
}